

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::FunctionDeclarationSyntax::FunctionDeclarationSyntax
          (FunctionDeclarationSyntax *this,SyntaxKind kind,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
          FunctionPrototypeSyntax *prototype,Token semi,SyntaxList<slang::syntax::SyntaxNode> *items
          ,Token end,NamedBlockClauseSyntax *endBlockName)

{
  pointer ppSVar1;
  size_type sVar2;
  SyntaxKind SVar3;
  undefined4 uVar4;
  FunctionPrototypeSyntax *pFVar5;
  long lVar6;
  undefined8 uVar7;
  FunctionPrototypeSyntax *local_38;
  
  uVar7 = semi._0_8_;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,kind,attributes);
  local_38 = prototype;
  not_null<slang::syntax::FunctionPrototypeSyntax*>::
  not_null<slang::syntax::FunctionPrototypeSyntax*,void>
            ((not_null<slang::syntax::FunctionPrototypeSyntax*> *)&this->prototype,&local_38);
  (this->semi).kind = (short)uVar7;
  (this->semi).field_0x2 = (char)((ulong)uVar7 >> 0x10);
  (this->semi).numFlags = (NumericTokenFlags)(char)((ulong)uVar7 >> 0x18);
  (this->semi).rawLen = (int)((ulong)uVar7 >> 0x20);
  (this->semi).info = semi.info;
  SVar3 = (items->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar4 = *(undefined4 *)&(items->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent =
       (items->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->items).super_SyntaxListBase.super_SyntaxNode.kind = SVar3;
  *(undefined4 *)&(this->items).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar4;
  (this->items).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_0046ff68;
  (this->items).super_SyntaxListBase.childCount = (items->super_SyntaxListBase).childCount;
  sVar2 = (items->super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>).size_;
  (this->items).super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>.data_ =
       (items->super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>).data_;
  (this->items).super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>.size_ = sVar2;
  (this->items).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00472ea0;
  (this->end).kind = end.kind;
  (this->end).field_0x2 = end._2_1_;
  (this->end).numFlags = (NumericTokenFlags)end.numFlags.raw;
  (this->end).rawLen = end.rawLen;
  (this->end).info = end.info;
  this->endBlockName = endBlockName;
  pFVar5 = not_null<slang::syntax::FunctionPrototypeSyntax_*>::get(&this->prototype);
  (pFVar5->super_SyntaxNode).parent = (SyntaxNode *)this;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  ppSVar1 = (this->items).super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>.data_;
  sVar2 = (this->items).super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>.size_;
  for (lVar6 = 0; sVar2 << 3 != lVar6; lVar6 = lVar6 + 8) {
    **(undefined8 **)((long)ppSVar1 + lVar6) = this;
  }
  if (this->endBlockName != (NamedBlockClauseSyntax *)0x0) {
    (this->endBlockName->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

FunctionDeclarationSyntax(SyntaxKind kind, const SyntaxList<AttributeInstanceSyntax>& attributes, FunctionPrototypeSyntax& prototype, Token semi, const SyntaxList<SyntaxNode>& items, Token end, NamedBlockClauseSyntax* endBlockName) :
        MemberSyntax(kind, attributes), prototype(&prototype), semi(semi), items(items), end(end), endBlockName(endBlockName) {
        this->prototype->parent = this;
        this->items.parent = this;
        for (auto child : this->items)
            child->parent = this;
        if (this->endBlockName) this->endBlockName->parent = this;
    }